

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
DisarmBeaconIRCCommand::trigger
          (DisarmBeaconIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  PlayerInfo *pPVar4;
  char *pcVar5;
  size_t sVar6;
  basic_string_view<char,_std::char_traits<char>_> *pbVar7;
  char *args_2;
  char *pcVar8;
  uint uVar9;
  bool bVar10;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  
  pcVar8 = nick._M_str;
  pbVar7 = (basic_string_view<char,_std::char_traits<char>_> *)nick._M_len;
  pcVar5 = channel._M_str;
  sVar6 = channel._M_len;
  if (parameters._M_len != 0) {
    args_2 = (char *)pbVar7;
    lVar2 = Jupiter::IRC::Client::getChannel(source,sVar6,pcVar5);
    if (lVar2 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      uVar9 = 0;
      bVar10 = false;
      while( true ) {
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        if (uVar3 == uVar9) break;
        uVar3 = RenX::getCore();
        pPVar4 = (PlayerInfo *)RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)pPVar4);
        if (cVar1 != '\0') {
          lVar2 = RenX::Server::getPlayerByPartName(pPVar4,parameters._M_len,parameters._M_str);
          if (lVar2 == 0) {
            args_2 = "Error: Player not found.";
            Jupiter::IRC::Client::sendNotice(source,pbVar7,pcVar8,0x18);
          }
          else {
            cVar1 = RenX::Server::disarmBeacon(pPVar4);
            if (cVar1 == '\0') {
              args_2 = "Error: Server does not support disarms.";
              Jupiter::IRC::Client::sendMessage(source,sVar6,pcVar5,0x27);
            }
            else {
              local_80._0_8_ = 0x19;
              local_80._8_8_ = "All beacons belonging to ";
              RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)&stack0xffffffffffffffb0);
              local_90._0_8_ = (pointer)0x15;
              local_90._8_8_ = "\x03 have been disarmed.";
              jessilib::
              join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                        (&local_70,(jessilib *)local_80,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffb0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90,(basic_string_view<char,_std::char_traits<char>_> *)args_2);
              args_2 = local_70._M_dataplus._M_p;
              Jupiter::IRC::Client::sendMessage(source,sVar6,pcVar5,local_70._M_string_length);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
            }
          }
          bVar10 = true;
        }
        uVar9 = uVar9 + 1;
      }
      if (!bVar10) {
        Jupiter::IRC::Client::sendNotice
                  (source,pbVar7,pcVar8,0x40,
                   "Error: Channel not attached to any connected Renegade X servers.");
      }
    }
    return;
  }
  Jupiter::IRC::Client::sendNotice
            (source,pbVar7,pcVar8,0x33,"Error: Too Few Parameters. Syntax: disarmb <player>");
  return;
}

Assistant:

void DisarmBeaconIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			int type = chan->getType();
			RenX::PlayerInfo *player;
			bool match = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					match = true;
					player = server->getPlayerByPartName(parameters);
					if (player != nullptr)
					{
						if (server->disarmBeacon(*player))
							source->sendMessage(channel, jessilib::join<std::string>("All beacons belonging to "sv, RenX::getFormattedPlayerName(*player), IRCCOLOR " have been disarmed."sv));
						else
							source->sendMessage(channel, "Error: Server does not support disarms."sv);
					}
					else
						source->sendNotice(nick, "Error: Player not found."sv);
				}
			}
			if (match == false)
				source->sendNotice(nick, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: disarmb <player>"sv);
}